

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

void __thiscall indigox::Molecule::~Molecule(Molecule *this)

{
  unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_> *in_RDI;
  vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
  *unaff_retaddr;
  
  std::unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>::~unique_ptr
            (in_RDI);
  std::shared_ptr<indigox::MolecularGraph>::~shared_ptr
            ((shared_ptr<indigox::MolecularGraph> *)0x10f3d0);
  std::
  map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  ::~map((map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
          *)0x10f3e1);
  std::
  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  ::~map((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
          *)0x10f3f2);
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
                    *)0x10f403);
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
                    *)0x10f411);
  std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
  ~vector((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
           *)unaff_retaddr);
  std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
  ~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  std::enable_shared_from_this<indigox::Molecule>::~enable_shared_from_this
            ((enable_shared_from_this<indigox::Molecule> *)0x10f449);
  return;
}

Assistant:

Molecule::~Molecule() { }